

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

bool __thiscall re2::Regexp::ComputeSimple(Regexp *this)

{
  byte bVar1;
  CharClassBuilder *pCVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar7;
  bool bVar8;
  LogMessage local_190;
  
  bVar3 = 1;
  switch(this->op_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    break;
  case '\x05':
  case '\x06':
    uVar5 = (ulong)this->nsub_;
    if (uVar5 < 2) {
      paVar7 = &this->field_5;
    }
    else {
      paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (uVar5 != 0) {
      lVar6 = 0;
      do {
        bVar8 = (paVar7[lVar6].subone_)->simple_ == '\0';
        bVar3 = !bVar8;
        if (bVar8) break;
        bVar8 = uVar5 - 1 != lVar6;
        lVar6 = lVar6 + 1;
      } while (bVar8);
    }
    break;
  case '\a':
  case '\b':
  case '\t':
    if (this->nsub_ < 2) {
      paVar7 = &this->field_5;
    }
    else {
      paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar7->subone_->simple_ != '\0') {
      bVar1 = paVar7->subone_->op_;
      if (bVar1 < 10) {
        bVar3 = (byte)(0x79 >> (bVar1 & 0x1f));
      }
      break;
    }
  case '\n':
    bVar3 = 0;
    break;
  case '\v':
    if (this->nsub_ < 2) {
      paVar7 = &this->field_5;
    }
    else {
      paVar7 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    bVar3 = paVar7->subone_->simple_ != '\0';
    break;
  case '\x14':
    pCVar2 = (this->field_7).field_3.ccb_;
    if (pCVar2 == (CharClassBuilder *)0x0) {
      iVar4 = *(int *)((this->field_7).field_3.cc_ + 4);
    }
    else {
      iVar4 = pCVar2->nrunes_;
    }
    bVar3 = iVar4 != 0x110000 && iVar4 != 0;
    break;
  default:
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/simplify.cc"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Case not handled in ComputeSimple: ",0x23);
    std::operator<<((ostream *)&local_190.str_,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Regexp::ComputeSimple() {
  Regexp** subs;
  switch (op_) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      return true;
    case kRegexpConcat:
    case kRegexpAlternate:
      // These are simple as long as the subpieces are simple.
      subs = sub();
      for (int i = 0; i < nsub_; i++)
        if (!subs[i]->simple())
          return false;
      return true;
    case kRegexpCharClass:
      // Simple as long as the char class is not empty, not full.
      if (ccb_ != NULL)
        return !ccb_->empty() && !ccb_->full();
      return !cc_->empty() && !cc_->full();
    case kRegexpCapture:
      subs = sub();
      return subs[0]->simple();
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      subs = sub();
      if (!subs[0]->simple())
        return false;
      switch (subs[0]->op_) {
        case kRegexpStar:
        case kRegexpPlus:
        case kRegexpQuest:
        case kRegexpEmptyMatch:
        case kRegexpNoMatch:
          return false;
        default:
          break;
      }
      return true;
    case kRegexpRepeat:
      return false;
  }
  LOG(DFATAL) << "Case not handled in ComputeSimple: " << op_;
  return false;
}